

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O3

opj_tgt_tree_t *
opj_tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v,
            opj_event_mgr_t *p_manager)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node_t *poVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 *pOVar5;
  opj_tgt_node *poVar6;
  ulong uVar7;
  OPJ_UINT32 OVar8;
  opj_tgt_node *poVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  OPJ_UINT32 local_128 [32];
  OPJ_UINT32 local_a8 [32];
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
LAB_00144a32:
    p_tree = (opj_tgt_tree_t *)0x0;
  }
  else {
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      local_a8[0] = p_num_leafs_h;
      local_128[0] = p_num_leafs_v;
      OVar2 = 0;
      uVar11 = 0xffffffff;
      OVar8 = p_num_leafs_h;
      OVar4 = p_num_leafs_v;
      do {
        uVar10 = OVar4 * OVar8;
        OVar8 = (int)((OVar8 - ((int)(OVar8 + 1) >> 0x1f)) + 1) >> 1;
        local_a8[uVar11 + 2] = OVar8;
        OVar4 = (int)((OVar4 - ((int)(OVar4 + 1) >> 0x1f)) + 1) >> 1;
        local_128[uVar11 + 2] = OVar4;
        OVar2 = OVar2 + uVar10;
        uVar11 = uVar11 + 1;
      } while (1 < uVar10);
      p_tree->numnodes = OVar2;
      if (OVar2 == 0) {
LAB_00144a2a:
        opj_tgt_destroy(p_tree);
        goto LAB_00144a32;
      }
      uVar10 = OVar2 * 0x18;
      if (p_tree->nodes_size < uVar10) {
        poVar3 = (opj_tgt_node_t *)opj_realloc(p_tree->nodes,(ulong)uVar10);
        if (poVar3 == (opj_tgt_node_t *)0x0) {
          opj_event_msg(p_manager,1,"Not enough memory to reinitialize the tag tree\n");
          goto LAB_00144a2a;
        }
        p_tree->nodes = poVar3;
        memset((void *)((long)&poVar3->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar10 - p_tree->nodes_size));
        p_tree->nodes_size = uVar10;
        p_num_leafs_h = p_tree->numleafsh;
        p_num_leafs_v = p_tree->numleafsv;
      }
      poVar3 = p_tree->nodes;
      if (uVar11 != 0) {
        poVar6 = poVar3 + p_num_leafs_v * p_num_leafs_h;
        uVar7 = 0;
        poVar9 = poVar6;
        do {
          OVar8 = local_128[uVar7];
          if (0 < (int)OVar8) {
            OVar4 = local_a8[uVar7];
            uVar10 = 0;
            do {
              uVar12 = OVar4 + 2;
              if (0 < (int)OVar4) {
                do {
                  poVar3->parent = poVar6;
                  if (uVar12 == 3) {
                    poVar6 = poVar6 + 1;
                    poVar3 = poVar3 + 1;
                    break;
                  }
                  poVar3[1].parent = poVar6;
                  poVar3 = poVar3 + 2;
                  poVar6 = poVar6 + 1;
                  uVar12 = uVar12 - 2;
                } while (2 < uVar12);
              }
              poVar1 = poVar6;
              if (uVar10 != OVar8 - 1 && (uVar10 & 1) == 0) {
                poVar6 = poVar9;
                poVar1 = poVar9 + (int)OVar4;
              }
              poVar9 = poVar1;
              uVar10 = uVar10 + 1;
            } while (uVar10 != OVar8);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar11);
      }
      poVar3->parent = (opj_tgt_node *)0x0;
    }
    OVar8 = p_tree->numnodes;
    if (OVar8 != 0) {
      pOVar5 = &p_tree->nodes->known;
      do {
        *(undefined8 *)(pOVar5 + -2) = 999;
        *pOVar5 = 0;
        pOVar5 = pOVar5 + 6;
        OVar8 = OVar8 - 1;
      } while (OVar8 != 0);
    }
  }
  return p_tree;
}

Assistant:

opj_tgt_tree_t *opj_tgt_init(opj_tgt_tree_t * p_tree, OPJ_UINT32 p_num_leafs_h,
                             OPJ_UINT32 p_num_leafs_v, opj_event_mgr_t *p_manager)
{
    OPJ_INT32 l_nplh[32];
    OPJ_INT32 l_nplv[32];
    opj_tgt_node_t *l_node = 00;
    opj_tgt_node_t *l_parent_node = 00;
    opj_tgt_node_t *l_parent_node0 = 00;
    OPJ_UINT32 i;
    OPJ_INT32 j, k;
    OPJ_UINT32 l_num_levels;
    OPJ_UINT32 n;
    OPJ_UINT32 l_node_size;

    if (! p_tree) {
        return 00;
    }

    if ((p_tree->numleafsh != p_num_leafs_h) ||
            (p_tree->numleafsv != p_num_leafs_v)) {
        p_tree->numleafsh = p_num_leafs_h;
        p_tree->numleafsv = p_num_leafs_v;

        l_num_levels = 0;
        l_nplh[0] = (OPJ_INT32)p_num_leafs_h;
        l_nplv[0] = (OPJ_INT32)p_num_leafs_v;
        p_tree->numnodes = 0;
        do {
            n = (OPJ_UINT32)(l_nplh[l_num_levels] * l_nplv[l_num_levels]);
            l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
            l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
            p_tree->numnodes += n;
            ++l_num_levels;
        } while (n > 1);

        /* ADD */
        if (p_tree->numnodes == 0) {
            opj_tgt_destroy(p_tree);
            return 00;
        }
        l_node_size = p_tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        if (l_node_size > p_tree->nodes_size) {
            opj_tgt_node_t* new_nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes,
                                        l_node_size);
            if (! new_nodes) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Not enough memory to reinitialize the tag tree\n");
                opj_tgt_destroy(p_tree);
                return 00;
            }
            p_tree->nodes = new_nodes;
            memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0,
                   l_node_size - p_tree->nodes_size);
            p_tree->nodes_size = l_node_size;
        }
        l_node = p_tree->nodes;
        l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < l_num_levels - 1; ++i) {
            for (j = 0; j < l_nplv[i]; ++j) {
                k = l_nplh[i];
                while (--k >= 0) {
                    l_node->parent = l_parent_node;
                    ++l_node;
                    if (--k >= 0) {
                        l_node->parent = l_parent_node;
                        ++l_node;
                    }
                    ++l_parent_node;
                }
                if ((j & 1) || j == l_nplv[i] - 1) {
                    l_parent_node0 = l_parent_node;
                } else {
                    l_parent_node = l_parent_node0;
                    l_parent_node0 += l_nplh[i];
                }
            }
        }
        l_node->parent = 0;
    }
    opj_tgt_reset(p_tree);

    return p_tree;
}